

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::~CheckerVisitor(CheckerVisitor *this)

{
  ~CheckerVisitor(this);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

CheckerVisitor::~CheckerVisitor() {
  for (auto &p : functionInfoMap) {
    if (p.second)
      p.second->~FunctionInfo();
  }
  for (auto ev : externalValues)
    ev->~ExternalValueExpr();
}